

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O0

int __thiscall
MeCab::DictionaryRewriter::open(DictionaryRewriter *this,char *__file,int __oflag,...)

{
  undefined1 uVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *str;
  string line;
  int append_to;
  ifstream ifs;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  ostream *in_stack_fffffffffffffcf0;
  Iconv *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd90;
  die local_259;
  string local_258 [36];
  int local_234;
  byte local_22e;
  die local_22d [13];
  long local_220 [65];
  long local_18;
  char *local_10;
  DictionaryRewriter *local_8;
  
  local_18 = ___oflag;
  local_10 = __file;
  local_8 = this;
  std::ifstream::ifstream(local_220,__file,_S_in);
  local_22e = 0;
  uVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if (!(bool)uVar1) {
    die::die(local_22d);
    local_22e = 1;
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x88);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"ifs");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"no such file or directory: ");
    poVar3 = std::operator<<(poVar3,local_10);
    die::operator&(local_22d,poVar3);
  }
  if ((local_22e & 1) != 0) {
    die::~die((die *)0x1e2f34);
  }
  local_234 = 0;
  std::__cxx11::string::string(local_258);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_220,local_258);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    if (local_18 != 0) {
      Iconv::convert(in_stack_fffffffffffffcf8,(string *)in_stack_fffffffffffffcf0);
    }
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) &&
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_258), *pcVar6 != '#')) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffcf0,
                              (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
      ;
      if (bVar2) {
        local_234 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffcf0,
                                (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8
                                                ));
        if (bVar2) {
          local_234 = 2;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffcf0,
                                  (char *)CONCAT44(in_stack_fffffffffffffcec,
                                                   in_stack_fffffffffffffce8));
          if (bVar2) {
            local_234 = 3;
          }
          else {
            if (local_234 == 0) {
              die::die(&local_259);
              poVar3 = std::operator<<((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                      );
              poVar3 = std::operator<<(poVar3,"(");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x95);
              poVar3 = std::operator<<(poVar3,") [");
              poVar3 = std::operator<<(poVar3,"append_to != 0");
              in_stack_fffffffffffffcf8 = (Iconv *)std::operator<<(poVar3,"] ");
              in_stack_fffffffffffffcf0 =
                   std::operator<<((ostream *)in_stack_fffffffffffffcf8,"no sections found");
              die::operator&(&local_259,in_stack_fffffffffffffcf0);
              die::~die((die *)0x1e31f5);
            }
            std::__cxx11::string::c_str();
            in_stack_fffffffffffffcec = local_234;
            if (local_234 == 1) {
              anon_unknown.dwarf_7d438::append_rewrite_rule
                        ((RewriteRules *)CONCAT17(uVar1,in_stack_fffffffffffffd90),(char *)this);
            }
            else if (local_234 == 2) {
              anon_unknown.dwarf_7d438::append_rewrite_rule
                        ((RewriteRules *)CONCAT17(uVar1,in_stack_fffffffffffffd90),(char *)this);
            }
            else if (local_234 == 3) {
              anon_unknown.dwarf_7d438::append_rewrite_rule
                        ((RewriteRules *)CONCAT17(uVar1,in_stack_fffffffffffffd90),(char *)this);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_258);
  uVar7 = std::ifstream::~ifstream(local_220);
  return (int)CONCAT71((int7)((ulong)uVar7 >> 8),1);
}

Assistant:

bool DictionaryRewriter::open(const char *filename,
                              Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;
  int append_to = 0;
  std::string line;
  while (std::getline(ifs, line)) {
    if (iconv) iconv->convert(&line);
    if (line.empty() || line[0] == '#') continue;
    if (line == "[unigram rewrite]") {
      append_to = 1;
    } else if (line == "[left rewrite]") {
      append_to = 2;
    } else if (line == "[right rewrite]") {
      append_to = 3;
    } else {
      CHECK_DIE(append_to != 0) << "no sections found";
      char *str = const_cast<char *>(line.c_str());
      switch (append_to) {
        case 1: append_rewrite_rule(&unigram_rewrite_, str); break;
        case 2: append_rewrite_rule(&left_rewrite_,    str); break;
        case 3: append_rewrite_rule(&right_rewrite_,   str); break;
      }
    }
  }
  return true;
}